

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_html(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  FILE *__s;
  long lVar5;
  REF_INT RVar6;
  int cell;
  REF_INT *o2n;
  REF_INT *n2o;
  REF_GRID local_b8;
  REF_NODE local_b0;
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->node;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x709,
           "ref_export_html","unable to open file");
    uVar3 = 2;
  }
  else {
    uVar3 = ref_node_compact(pRVar1,&o2n,&n2o);
    if (uVar3 == 0) {
      local_b0 = pRVar1;
      fwrite("<html>\n",7,1,__s);
      fwrite("  <head>\n",9,1,__s);
      fwrite("    <title>refine export</title>\n",0x21,1,__s);
      fwrite("    <link rel=\'stylesheet\' type=\'text/css\'\n",0x2b,1,__s);
      fwrite("          href=\'http://www.x3dom.org/download/x3dom.css\'>\n",0x3a,1,__s);
      fwrite("    </link>\n",0xc,1,__s);
      fwrite("    <script type=\'text/javascript\'\n",0x23,1,__s);
      fwrite("          src=\'http://www.x3dom.org/download/x3dom.js\'>\n",0x38,1,__s);
      fwrite("    </script>\n",0xe,1,__s);
      fwrite("    <style>\n",0xc,1,__s);
      fprintf(__s,"      x3d {width:100%%;height:100%%;border:none}\n");
      fprintf(__s,"      body {margin:0;width:100%%;height:100%%;}\n");
      fwrite("    </style>\n",0xd,1,__s);
      fwrite("  </head>\n",10,1,__s);
      fwrite("  <body id=\'body\'>\n",0x13,1,__s);
      fwrite("    <a href=\"http://x3dom.org/docs/dev/navigation.html\">\n",0x39,1,__s);
      fwrite("camera control help\n",0x14,1,__s);
      fwrite("    </a>\n",9,1,__s);
      fwrite("    <x3d id=\'x3d\'><scene><shape>\n",0x21,1,__s);
      fwrite("      <IndexedLineSet coordIndex=\'\n",0x23,1,__s);
      pRVar2 = ref_grid->cell[3];
      local_b8 = ref_grid;
      if (0 < pRVar2->max) {
        RVar6 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar2,RVar6,nodes);
          if (RVar4 == 0) {
            if (0 < pRVar2->node_per) {
              lVar5 = 0;
              do {
                fprintf(__s," %d",(ulong)(uint)o2n[nodes[lVar5]]);
                lVar5 = lVar5 + 1;
              } while (lVar5 < pRVar2->node_per);
            }
            fprintf(__s," %d %d\n",(ulong)(uint)o2n[nodes[0]],0xffffffff);
          }
          RVar6 = RVar6 + 1;
        } while (RVar6 < pRVar2->max);
      }
      pRVar2 = local_b8->cell[6];
      if (0 < pRVar2->max) {
        cell = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar2,cell,nodes);
          if (RVar4 == 0) {
            if (0 < pRVar2->node_per) {
              lVar5 = 0;
              do {
                fprintf(__s," %d",(ulong)(uint)o2n[nodes[lVar5]]);
                lVar5 = lVar5 + 1;
              } while (lVar5 < pRVar2->node_per);
            }
            fprintf(__s," %d %d\n",(ulong)(uint)o2n[nodes[0]],0xffffffff);
          }
          cell = cell + 1;
        } while (cell < pRVar2->max);
      }
      pRVar2 = local_b8->cell[8];
      if (0 < pRVar2->max) {
        RVar6 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar2,RVar6,nodes);
          if (RVar4 == 0) {
            fprintf(__s," %d %d %d %d %d %d %d %d\n",(ulong)(uint)o2n[nodes[0]],
                    (ulong)(uint)o2n[nodes[1]],(ulong)(uint)o2n[nodes[2]],(ulong)(uint)o2n[nodes[3]]
                    ,(ulong)(uint)o2n[nodes[0]],(ulong)(uint)o2n[nodes[3]],
                    (ulong)(uint)o2n[nodes[1]],0xffffffffffffffff);
          }
          RVar6 = RVar6 + 1;
        } while (RVar6 < pRVar2->max);
      }
      fwrite("      \' >\n",10,1,__s);
      fwrite("      <Coordinate point=\'\n",0x1a,1,__s);
      pRVar1 = local_b0;
      if (0 < local_b0->n) {
        lVar5 = 0;
        do {
          fprintf(__s," %.15e",pRVar1->real[(long)n2o[lVar5] * 0xf]);
          fprintf(__s," %.15e",pRVar1->real[(long)n2o[lVar5] * 0xf + 1]);
          fprintf(__s," %.15e\n",pRVar1->real[(long)n2o[lVar5] * 0xf + 2]);
          lVar5 = lVar5 + 1;
        } while (lVar5 < pRVar1->n);
      }
      fwrite("      \' />\n",0xb,1,__s);
      fwrite("      </IndexedLineSet>\n",0x18,1,__s);
      fwrite("    </shape></scene></x3d>\n",0x1b,1,__s);
      fwrite("  </body>\n",10,1,__s);
      fwrite("</html>\n",8,1,__s);
      if (n2o != (REF_INT *)0x0) {
        free(n2o);
      }
      if (o2n != (REF_INT *)0x0) {
        free(o2n);
      }
      fclose(__s);
      uVar3 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x70b,"ref_export_html",(ulong)uVar3,"compact");
    }
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_export_html(REF_GRID ref_grid,
                                          const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *o2n, *n2o;

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  fprintf(f, "<html>\n");
  fprintf(f, "  <head>\n");
  fprintf(f, "    <title>refine export</title>\n");
  fprintf(f, "    <link rel='stylesheet' type='text/css'\n");
  fprintf(f, "          href='http://www.x3dom.org/download/x3dom.css'>\n");
  fprintf(f, "    </link>\n");
  fprintf(f, "    <script type='text/javascript'\n");
  fprintf(f, "          src='http://www.x3dom.org/download/x3dom.js'>\n");
  fprintf(f, "    </script>\n");
  fprintf(f, "    <style>\n");
  fprintf(f, "      x3d {width:100%%;height:100%%;border:none}\n");
  fprintf(f, "      body {margin:0;width:100%%;height:100%%;}\n");
  fprintf(f, "    </style>\n");
  fprintf(f, "  </head>\n");
  fprintf(f, "  <body id='body'>\n");
  fprintf(f, "    <a href=\"http://x3dom.org/docs/dev/navigation.html\">\n");
  fprintf(f, "camera control help\n");
  fprintf(f, "    </a>\n");
  fprintf(f, "    <x3d id='x3d'><scene><shape>\n");

  fprintf(f, "      <IndexedLineSet coordIndex='\n");
  if (REF_TRUE) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        fprintf(f, " %d", o2n[nodes[node]]);
      fprintf(f, " %d %d\n", o2n[nodes[0]], -1);
    }
  }

  if (REF_TRUE) {
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        fprintf(f, " %d", o2n[nodes[node]]);
      fprintf(f, " %d %d\n", o2n[nodes[0]], -1);
    }
  }

  if (REF_TRUE) {
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      fprintf(f, " %d %d %d %d %d %d %d %d\n", o2n[nodes[0]], o2n[nodes[1]],
              o2n[nodes[2]], o2n[nodes[3]], o2n[nodes[0]], o2n[nodes[3]],
              o2n[nodes[1]], -1);
    }
  }

  fprintf(f, "      ' >\n");

  fprintf(f, "      <Coordinate point='\n");
  for (node = 0; node < ref_node_n(ref_node); node++) {
    fprintf(f, " %.15e", ref_node_xyz(ref_node, 0, n2o[node]));
    fprintf(f, " %.15e", ref_node_xyz(ref_node, 1, n2o[node]));
    fprintf(f, " %.15e\n", ref_node_xyz(ref_node, 2, n2o[node]));
  }
  fprintf(f, "      ' />\n");

  fprintf(f, "      </IndexedLineSet>\n");

  fprintf(f, "    </shape></scene></x3d>\n");
  fprintf(f, "  </body>\n");
  fprintf(f, "</html>\n");

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}